

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlpg.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_4023::InputSourcePreprocessing::Get
          (InputSourcePreprocessing *this,vector<double,_std::allocator<double>_> *buffer)

{
  pointer pdVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  
  if (this->is_valid_ != true) {
    return false;
  }
  iVar3 = (*this->source_->_vptr_InputSourceInterface[4])();
  if ((char)iVar3 == '\0') {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (this->input_format_ == kMeanTimesPrecisionAndPrecision) {
      iVar3 = this->half_read_size_;
      lVar4 = (long)iVar3;
      pdVar5 = (buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (0 < lVar4) {
        lVar6 = 0;
        do {
          pdVar5[lVar4 + lVar6] = 1.0 / pdVar5[lVar4 + lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
      }
      lVar6 = lVar4;
      if (0 < iVar3) {
        do {
          *pdVar5 = pdVar5[lVar4] * *pdVar5;
          pdVar5 = pdVar5 + 1;
          lVar6 = lVar6 + -1;
        } while (lVar6 != 0);
      }
    }
    else if ((this->input_format_ == kMeanAndPrecision) &&
            (lVar4 = (long)this->half_read_size_, 0 < lVar4)) {
      pdVar1 = (buffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        pdVar1[lVar4 + lVar6] = 1.0 / pdVar1[lVar4 + lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar4 != lVar6);
    }
  }
  return bVar2;
}

Assistant:

bool Get(std::vector<double>* buffer) override {
    if (!is_valid_) {
      return false;
    }
    if (!source_->Get(buffer)) {
      return false;
    }
    switch (input_format_) {
      case kMeanAndVariance: {
        // Nothing to do.
        break;
      }
      case kMeanAndPrecision: {
        double* variance(&((*buffer)[half_read_size_]));
        for (int i(0); i < half_read_size_; ++i) {
          variance[i] = 1.0 / variance[i];
        }
        break;
      }
      case kMeanTimesPrecisionAndPrecision: {
        double* variance(&((*buffer)[half_read_size_]));
        for (int i(0); i < half_read_size_; ++i) {
          variance[i] = 1.0 / variance[i];
        }
        double* mean(&((*buffer)[0]));
        for (int i(0); i < half_read_size_; ++i) {
          mean[i] *= variance[i];
        }
        break;
      }
      default: {
        break;
      }
    }
    return true;
  }